

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

string * __thiscall cppcms::http::request::script_name_abi_cxx11_(request *this)

{
  long in_RSI;
  connection *in_RDI;
  
  cppcms::impl::cgi::connection::getenv_abi_cxx11_(in_RDI,*(char **)(in_RSI + 200));
  return (string *)in_RDI;
}

Assistant:

std::string request::script_name() { return conn_->getenv("SCRIPT_NAME"); }